

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O3

void vkt::rasterization::anon_unknown_0::createRasterizationTests(TestCaseGroup *rasterizationTests)

{
  VkPrimitiveTopology VVar1;
  VkFrontFace VVar2;
  undefined4 uVar3;
  uint uVar4;
  FrontFaceOrder *pFVar5;
  TestNode *pTVar6;
  TestNode *pTVar7;
  long *plVar8;
  long lVar9;
  TestNode *pTVar10;
  ostream *poVar11;
  long *plVar12;
  long lVar13;
  TestContext *pTVar14;
  string name;
  long *local_260;
  long local_258;
  long local_250;
  long lStack_248;
  TestContext *local_240;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  ios_base local_1a8 [264];
  undefined4 *local_a0;
  TestNode *local_98;
  allocator<char> local_89;
  uint local_88;
  VkCullModeFlags local_84;
  FrontFaceOrder *local_80;
  PrimitiveType *local_78;
  long local_70;
  long local_68;
  TestNode *local_60;
  CullMode *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pTVar14 = (rasterizationTests->super_TestNode).m_testCtx;
  pTVar6 = (TestNode *)operator_new(0x70);
  local_240 = pTVar14;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pTVar14,"primitives","Primitive rasterization");
  local_98 = &rasterizationTests->super_TestNode;
  tcu::TestNode::addChild(&rasterizationTests->super_TestNode,pTVar6);
  pTVar7 = (TestNode *)operator_new(0x78);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"triangles","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, verify rasterization result"
             ,"");
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d00ea0;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x78);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"triangle_strip","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP, verify rasterization result"
             ,"");
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01030;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x78);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"triangle_fan","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN, verify rasterization result",
             "");
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d010f8;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"lines","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST, verify rasterization result","")
  ;
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d011c0;
  *(undefined4 *)&pTVar7[1].m_testCtx = 0;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"line_strip","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_STRIP, verify rasterization result",""
            );
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d012f0;
  *(undefined4 *)&pTVar7[1].m_testCtx = 0;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"lines_wide","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST with wide lines, verify rasterization result"
             ,"");
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d011c0;
  *(undefined4 *)&pTVar7[1].m_testCtx = 1;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"line_strip_wide","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_STRIP with wide lines, verify rasterization result"
             ,"");
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d012f0;
  *(undefined4 *)&pTVar7[1].m_testCtx = 1;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"points","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_POINT_LIST, verify rasterization result",""
            );
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d013b8;
  *(undefined4 *)&pTVar7[1].m_testCtx = 1;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_240,"fill_rules","Primitive fill rules");
  tcu::TestNode::addChild(local_98,pTVar6);
  pTVar7 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"basic_quad","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Verify fill rules","");
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01480;
  *(undefined4 *)&pTVar7[1].m_testCtx = 0;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"basic_quad_reverse","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Verify fill rules","");
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01480;
  *(undefined4 *)&pTVar7[1].m_testCtx = 1;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"clipped_full","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Verify fill rules","");
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01480;
  *(undefined4 *)&pTVar7[1].m_testCtx = 2;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"clipped_partly","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Verify fill rules","");
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01480;
  *(undefined4 *)&pTVar7[1].m_testCtx = 3;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"projected","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Verify fill rules","");
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01480;
  *(undefined4 *)&pTVar7[1].m_testCtx = 4;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  pTVar6 = local_98;
  pTVar14 = local_240;
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar7,pTVar14,"culling","Culling");
  local_60 = pTVar7;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  lVar13 = 0;
  do {
    local_58 = createRasterizationTests::cullModes + lVar13;
    local_84 = createRasterizationTests::cullModes[lVar13].mode;
    lVar9 = 0;
    local_70 = lVar13;
    do {
      local_78 = createRasterizationTests::primitiveTypes + lVar9;
      local_88 = 0xd00e01;
      lVar13 = 0;
      local_68 = lVar9;
      do {
        local_80 = createRasterizationTests::frontOrders + lVar13;
        local_a0 = (undefined4 *)0x0;
        do {
          if ((local_84 != 3) ||
             (*(int *)((long)&createRasterizationTests::polygonModes[0].mode + (long)local_a0) == 0)
             ) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_50,local_58->prefix,&local_89);
            plVar8 = (long *)std::__cxx11::string::append((char *)local_50);
            pFVar5 = local_80;
            plVar12 = plVar8 + 2;
            if ((long *)*plVar8 == plVar12) {
              local_228 = *plVar12;
              lStack_220 = plVar8[3];
              local_238 = &local_228;
            }
            else {
              local_228 = *plVar12;
              local_238 = (long *)*plVar8;
            }
            local_230 = plVar8[1];
            *plVar8 = (long)plVar12;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_238);
            plVar12 = plVar8 + 2;
            if ((long *)*plVar8 == plVar12) {
              local_250 = *plVar12;
              lStack_248 = plVar8[3];
              local_260 = &local_250;
            }
            else {
              local_250 = *plVar12;
              local_260 = (long *)*plVar8;
            }
            local_258 = plVar8[1];
            *plVar8 = (long)plVar12;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_260);
            local_218 = &local_208;
            plVar12 = plVar8 + 2;
            if ((long *)*plVar8 == plVar12) {
              local_208 = *plVar12;
              lStack_200 = plVar8[3];
            }
            else {
              local_208 = *plVar12;
              local_218 = (long *)*plVar8;
            }
            local_210 = plVar8[1];
            *plVar8 = (long)plVar12;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            if (local_260 != &local_250) {
              operator_delete(local_260,local_250 + 1);
            }
            if (local_238 != &local_228) {
              operator_delete(local_238,local_228 + 1);
            }
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            pTVar6 = (TestNode *)operator_new(0x88);
            local_260 = &local_250;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_260,"Test primitive culling.","");
            VVar1 = local_78->type;
            VVar2 = pFVar5->mode;
            uVar3 = *(undefined4 *)
                     ((long)&createRasterizationTests::polygonModes[0].mode + (long)local_a0);
            tcu::TestCase::TestCase((TestCase *)pTVar6,pTVar14,(char *)local_218,(char *)local_260);
            pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
            pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01578;
            *(VkCullModeFlags *)&pTVar6[1].m_testCtx = local_84;
            *(VkPrimitiveTopology *)((long)&pTVar6[1].m_testCtx + 4) = VVar1;
            *(VkFrontFace *)&pTVar6[1].m_name._M_dataplus._M_p = VVar2;
            *(undefined4 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = uVar3;
            tcu::TestNode::addChild(local_60,pTVar6);
            if (local_260 != &local_250) {
              operator_delete(local_260,local_250 + 1);
            }
            pTVar14 = local_240;
            if (local_218 != &local_208) {
              operator_delete(local_218,local_208 + 1);
            }
          }
          local_a0 = (undefined4 *)((long)local_a0 + 0x10);
        } while (local_a0 != (undefined4 *)0x30);
        lVar13 = 1;
        uVar4 = local_88 & 1;
        local_88 = 0;
      } while (uVar4 != 0);
      lVar9 = local_68 + 1;
    } while (lVar9 != 3);
    lVar13 = local_70 + 1;
  } while (lVar13 != 3);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pTVar14,"interpolation","Test interpolation");
  tcu::TestNode::addChild(local_98,pTVar6);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pTVar14,"basic","Non-projective interpolation");
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar10 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"triangles","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify triangle interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar10,local_240,(char *)local_218,(char *)local_260);
  pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01638;
  pTVar10[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar10[1].m_testCtx = (TestContext *)0x3;
  tcu::TestNode::addChild(pTVar7,pTVar10);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar10 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"triangle_strip","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify triangle strip interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar10,local_240,(char *)local_218,(char *)local_260);
  pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01638;
  pTVar10[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar10[1].m_testCtx = (TestContext *)0x4;
  tcu::TestNode::addChild(pTVar7,pTVar10);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar10 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"triangle_fan","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify triangle fan interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar10,local_240,(char *)local_218,(char *)local_260);
  pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01638;
  pTVar10[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar10[1].m_testCtx = (TestContext *)0x5;
  tcu::TestNode::addChild(pTVar7,pTVar10);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar10 = (TestNode *)operator_new(0x88);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"lines","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify line interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar10,local_240,(char *)local_218,(char *)local_260);
  pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d016f8;
  pTVar10[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar10[1].m_testCtx = (TestContext *)&DAT_00000001;
  *(undefined4 *)&pTVar10[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(pTVar7,pTVar10);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar10 = (TestNode *)operator_new(0x88);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"line_strip","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify line strip interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar10,local_240,(char *)local_218,(char *)local_260);
  pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d016f8;
  pTVar10[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar10[1].m_testCtx = (TestContext *)0x2;
  *(undefined4 *)&pTVar10[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(pTVar7,pTVar10);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar10 = (TestNode *)operator_new(0x88);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"lines_wide","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify wide line interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar10,local_240,(char *)local_218,(char *)local_260);
  pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d016f8;
  pTVar10[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar10[1].m_testCtx = (TestContext *)&DAT_00000001;
  *(undefined4 *)&pTVar10[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(pTVar7,pTVar10);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar10 = (TestNode *)operator_new(0x88);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"line_strip_wide","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify wide line strip interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar10,local_240,(char *)local_218,(char *)local_260);
  pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d016f8;
  pTVar10[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar10[1].m_testCtx = (TestContext *)0x2;
  *(undefined4 *)&pTVar10[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(pTVar7,pTVar10);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,local_240,"projected","Projective interpolation");
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar6 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"triangles","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify triangle interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_240,(char *)local_218,(char *)local_260);
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01638;
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6[1].m_testCtx = (TestContext *)0x200000003;
  tcu::TestNode::addChild(pTVar7,pTVar6);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"triangle_strip","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify triangle strip interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_240,(char *)local_218,(char *)local_260);
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01638;
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6[1].m_testCtx = (TestContext *)0x200000004;
  tcu::TestNode::addChild(pTVar7,pTVar6);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"triangle_fan","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify triangle fan interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_240,(char *)local_218,(char *)local_260);
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01638;
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6[1].m_testCtx = (TestContext *)0x200000005;
  tcu::TestNode::addChild(pTVar7,pTVar6);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x88);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"lines","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify line interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_240,(char *)local_218,(char *)local_260);
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d016f8;
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6[1].m_testCtx = (TestContext *)0x200000001;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(pTVar7,pTVar6);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x88);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"line_strip","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify line strip interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_240,(char *)local_218,(char *)local_260);
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d016f8;
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6[1].m_testCtx = (TestContext *)0x200000002;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(pTVar7,pTVar6);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x88);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"lines_wide","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify wide line interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_240,(char *)local_218,(char *)local_260);
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d016f8;
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6[1].m_testCtx = (TestContext *)0x200000001;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(pTVar7,pTVar6);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x88);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"line_strip_wide","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify wide line strip interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_240,(char *)local_218,(char *)local_260);
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d016f8;
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6[1].m_testCtx = (TestContext *)0x200000002;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(pTVar7,pTVar6);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_240,"flatshading","Test flatshading");
  tcu::TestNode::addChild(local_98,pTVar6);
  pTVar7 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"triangles","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify triangle flatshading","");
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01638;
  pTVar7[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar7[1].m_testCtx = (TestContext *)0x400000003;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"triangle_strip","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify triangle strip flatshading","");
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01638;
  pTVar7[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar7[1].m_testCtx = (TestContext *)0x400000004;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x80);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"triangle_fan","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify triangle fan flatshading","");
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01638;
  pTVar7[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar7[1].m_testCtx = (TestContext *)0x400000005;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x88);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"lines","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Verify line flatshading","")
  ;
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d016f8;
  pTVar7[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar7[1].m_testCtx = (TestContext *)0x400000001;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x88);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"line_strip","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify line strip flatshading","");
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d016f8;
  pTVar7[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar7[1].m_testCtx = (TestContext *)0x400000002;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x88);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"lines_wide","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify wide line flatshading","");
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d016f8;
  pTVar7[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar7[1].m_testCtx = (TestContext *)0x400000001;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x88);
  local_218 = &local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"line_strip_wide","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Verify wide line strip flatshading","");
  tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_218,(char *)local_260);
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d016f8;
  pTVar7[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar7[1].m_testCtx = (TestContext *)0x400000002;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  local_a0 = &DAT_00b21f50;
  lVar13 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,"_multisample_",0xd);
    poVar11 = (ostream *)std::ostream::operator<<(&local_218,2 << ((byte)lVar13 & 0x1f));
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_bit",4);
    pTVar6 = (TestNode *)operator_new(0x70);
    std::__cxx11::stringbuf::str();
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,0xb1c510);
    local_260 = &local_250;
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_250 = *plVar12;
      lStack_248 = plVar8[3];
    }
    else {
      local_250 = *plVar12;
      local_260 = (long *)*plVar8;
    }
    local_258 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,local_240,(char *)local_260,"Primitive rasterization");
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    tcu::TestNode::addChild(local_98,pTVar6);
    pTVar7 = (TestNode *)operator_new(0x78);
    local_260 = &local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"triangles","");
    local_238 = &local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, verify rasterization result"
               ,"");
    uVar3 = *local_a0;
    tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_260,(char *)local_238);
    *(undefined4 *)&pTVar7[1]._vptr_TestNode = uVar3;
    *(undefined4 *)((long)&pTVar7[1]._vptr_TestNode + 4) = 0;
    pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d00ea0;
    tcu::TestNode::addChild(pTVar6,pTVar7);
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    pTVar7 = (TestNode *)operator_new(0x80);
    local_260 = &local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"lines","");
    local_238 = &local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST, verify rasterization result",
               "");
    tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_260,(char *)local_238);
    *(undefined4 *)&pTVar7[1]._vptr_TestNode = uVar3;
    *(undefined8 *)((long)&pTVar7[1]._vptr_TestNode + 4) = 0;
    pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d011c0;
    tcu::TestNode::addChild(pTVar6,pTVar7);
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    pTVar7 = (TestNode *)operator_new(0x80);
    local_260 = &local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"lines_wide","");
    local_238 = &local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST with wide lines, verify rasterization result"
               ,"");
    tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_260,(char *)local_238);
    *(undefined4 *)&pTVar7[1]._vptr_TestNode = uVar3;
    *(undefined8 *)((long)&pTVar7[1]._vptr_TestNode + 4) = 0x100000000;
    pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d011c0;
    tcu::TestNode::addChild(pTVar6,pTVar7);
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    pTVar7 = (TestNode *)operator_new(0x80);
    local_260 = &local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"points","");
    local_238 = &local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "Render primitives as VK_PRIMITIVE_TOPOLOGY_POINT_LIST, verify rasterization result",
               "");
    tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_260,(char *)local_238);
    *(undefined4 *)&pTVar7[1]._vptr_TestNode = uVar3;
    *(undefined8 *)((long)&pTVar7[1]._vptr_TestNode + 4) = 0x100000000;
    pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d013b8;
    tcu::TestNode::addChild(pTVar6,pTVar7);
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    pTVar6 = (TestNode *)operator_new(0x70);
    std::__cxx11::stringbuf::str();
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,0xb2121a);
    local_260 = &local_250;
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_250 = *plVar12;
      lStack_248 = plVar8[3];
    }
    else {
      local_250 = *plVar12;
      local_260 = (long *)*plVar8;
    }
    local_258 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,local_240,(char *)local_260,"Primitive fill rules");
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    tcu::TestNode::addChild(local_98,pTVar6);
    pTVar7 = (TestNode *)operator_new(0x80);
    local_260 = &local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"basic_quad","");
    local_238 = &local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Verify fill rules","");
    tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_260,(char *)local_238);
    *(undefined4 *)&pTVar7[1]._vptr_TestNode = uVar3;
    *(undefined8 *)((long)&pTVar7[1]._vptr_TestNode + 4) = 0;
    pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01480;
    tcu::TestNode::addChild(pTVar6,pTVar7);
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    pTVar7 = (TestNode *)operator_new(0x80);
    local_260 = &local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"basic_quad_reverse","");
    local_238 = &local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Verify fill rules","");
    tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_260,(char *)local_238);
    *(undefined4 *)&pTVar7[1]._vptr_TestNode = uVar3;
    *(undefined8 *)((long)&pTVar7[1]._vptr_TestNode + 4) = 0x100000000;
    pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01480;
    tcu::TestNode::addChild(pTVar6,pTVar7);
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    pTVar7 = (TestNode *)operator_new(0x80);
    local_260 = &local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"clipped_full","");
    local_238 = &local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Verify fill rules","");
    tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_260,(char *)local_238);
    *(undefined4 *)&pTVar7[1]._vptr_TestNode = uVar3;
    *(undefined8 *)((long)&pTVar7[1]._vptr_TestNode + 4) = 0x200000000;
    pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01480;
    tcu::TestNode::addChild(pTVar6,pTVar7);
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    pTVar7 = (TestNode *)operator_new(0x80);
    local_260 = &local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"clipped_partly","");
    local_238 = &local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Verify fill rules","");
    tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_260,(char *)local_238);
    *(undefined4 *)&pTVar7[1]._vptr_TestNode = uVar3;
    *(undefined8 *)((long)&pTVar7[1]._vptr_TestNode + 4) = 0x300000000;
    pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01480;
    tcu::TestNode::addChild(pTVar6,pTVar7);
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    pTVar7 = (TestNode *)operator_new(0x80);
    local_260 = &local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"projected","");
    local_238 = &local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Verify fill rules","");
    tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_260,(char *)local_238);
    *(undefined4 *)&pTVar7[1]._vptr_TestNode = uVar3;
    *(undefined8 *)((long)&pTVar7[1]._vptr_TestNode + 4) = 0x400000000;
    pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01480;
    tcu::TestNode::addChild(pTVar6,pTVar7);
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    pTVar6 = (TestNode *)operator_new(0x70);
    std::__cxx11::stringbuf::str();
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,0xb212fe);
    local_260 = &local_250;
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_250 = *plVar12;
      lStack_248 = plVar8[3];
    }
    else {
      local_250 = *plVar12;
      local_260 = (long *)*plVar8;
    }
    local_258 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,local_240,(char *)local_260,"Test interpolation");
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    tcu::TestNode::addChild(local_98,pTVar6);
    pTVar7 = (TestNode *)operator_new(0x80);
    local_260 = &local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"triangles","");
    local_238 = &local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"Verify triangle interpolation","");
    tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_260,(char *)local_238);
    *(undefined4 *)&pTVar7[1]._vptr_TestNode = uVar3;
    *(undefined4 *)((long)&pTVar7[1]._vptr_TestNode + 4) = 0;
    pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d01638;
    pTVar7[1].m_testCtx = (TestContext *)0x3;
    tcu::TestNode::addChild(pTVar6,pTVar7);
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    pTVar7 = (TestNode *)operator_new(0x88);
    local_260 = &local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"lines","");
    local_238 = &local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"Verify line interpolation","");
    tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_260,(char *)local_238);
    *(undefined4 *)&pTVar7[1]._vptr_TestNode = uVar3;
    pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d016f8;
    *(undefined8 *)((long)&pTVar7[1]._vptr_TestNode + 4) = 0x100000000;
    *(undefined8 *)((long)&pTVar7[1].m_testCtx + 4) = 0;
    tcu::TestNode::addChild(pTVar6,pTVar7);
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    pTVar7 = (TestNode *)operator_new(0x88);
    local_260 = &local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"lines_wide","");
    local_238 = &local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"Verify wide line interpolation","");
    tcu::TestCase::TestCase((TestCase *)pTVar7,local_240,(char *)local_260,(char *)local_238);
    *(undefined4 *)&pTVar7[1]._vptr_TestNode = uVar3;
    pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d016f8;
    *(undefined8 *)((long)&pTVar7[1]._vptr_TestNode + 4) = 0x100000000;
    *(undefined8 *)((long)&pTVar7[1].m_testCtx + 4) = 0x100000000;
    tcu::TestNode::addChild(pTVar6,pTVar7);
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_218);
    std::ios_base::~ios_base(local_1a8);
    lVar13 = lVar13 + 1;
    local_a0 = local_a0 + 1;
  } while (lVar13 != 6);
  return;
}

Assistant:

void createRasterizationTests (tcu::TestCaseGroup* rasterizationTests)
{
	tcu::TestContext&	testCtx		=	rasterizationTests->getTestContext();

	// .primitives
	{
		tcu::TestCaseGroup* const primitives = new tcu::TestCaseGroup(testCtx, "primitives", "Primitive rasterization");

		rasterizationTests->addChild(primitives);

		primitives->addChild(new BaseTestCase<TrianglesTestInstance>		(testCtx, "triangles",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, verify rasterization result"));
		primitives->addChild(new BaseTestCase<TriangleStripTestInstance>	(testCtx, "triangle_strip",		"Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP, verify rasterization result"));
		primitives->addChild(new BaseTestCase<TriangleFanTestInstance>		(testCtx, "triangle_fan",		"Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN, verify rasterization result"));
		primitives->addChild(new WidenessTestCase<LinesTestInstance>		(testCtx, "lines",				"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new WidenessTestCase<LineStripTestInstance>	(testCtx, "line_strip",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_STRIP, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new WidenessTestCase<LinesTestInstance>		(testCtx, "lines_wide",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new WidenessTestCase<LineStripTestInstance>	(testCtx, "line_strip_wide",	"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_STRIP with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new WidenessTestCase<PointTestInstance>		(testCtx, "points",				"Render primitives as VK_PRIMITIVE_TOPOLOGY_POINT_LIST, verify rasterization result",						PRIMITIVEWIDENESS_WIDE));
	}

	// .fill_rules
	{
		tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(testCtx, "fill_rules", "Primitive fill rules");

		rasterizationTests->addChild(fillRules);

		fillRules->addChild(new FillRuleTestCase(testCtx,	"basic_quad",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_BASIC));
		fillRules->addChild(new FillRuleTestCase(testCtx,	"basic_quad_reverse",	"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_REVERSED));
		fillRules->addChild(new FillRuleTestCase(testCtx,	"clipped_full",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_CLIPPED_FULL));
		fillRules->addChild(new FillRuleTestCase(testCtx,	"clipped_partly",		"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_CLIPPED_PARTIAL));
		fillRules->addChild(new FillRuleTestCase(testCtx,	"projected",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_PROJECTED));
	}

	// .culling
	{
		static const struct CullMode
		{
			VkCullModeFlags	mode;
			const char*		prefix;
		} cullModes[] =
		{
			{ VK_CULL_MODE_FRONT_BIT,				"front_"	},
			{ VK_CULL_MODE_BACK_BIT,				"back_"		},
			{ VK_CULL_MODE_FRONT_AND_BACK,			"both_"		},
		};
		static const struct PrimitiveType
		{
			VkPrimitiveTopology	type;
			const char*			name;
		} primitiveTypes[] =
		{
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,			"triangles"			},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,			"triangle_strip"	},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,			"triangle_fan"		},
		};
		static const struct FrontFaceOrder
		{
			VkFrontFace	mode;
			const char*	postfix;
		} frontOrders[] =
		{
			{ VK_FRONT_FACE_COUNTER_CLOCKWISE,	""			},
			{ VK_FRONT_FACE_CLOCKWISE,			"_reverse"	},
		};

		static const struct PolygonMode
		{
			VkPolygonMode	mode;
			const char*		name;
		} polygonModes[] =
		{
			{ VK_POLYGON_MODE_FILL,		""		},
			{ VK_POLYGON_MODE_LINE,		"_line"		},
			{ VK_POLYGON_MODE_POINT,	"_point"	}
		};

		tcu::TestCaseGroup* const culling = new tcu::TestCaseGroup(testCtx, "culling", "Culling");

		rasterizationTests->addChild(culling);

		for (int cullModeNdx	= 0; cullModeNdx	< DE_LENGTH_OF_ARRAY(cullModes);		++cullModeNdx)
		for (int primitiveNdx	= 0; primitiveNdx	< DE_LENGTH_OF_ARRAY(primitiveTypes);	++primitiveNdx)
		for (int frontOrderNdx	= 0; frontOrderNdx	< DE_LENGTH_OF_ARRAY(frontOrders);		++frontOrderNdx)
		for (int polygonModeNdx = 0; polygonModeNdx	< DE_LENGTH_OF_ARRAY(polygonModes);		++polygonModeNdx)
		{
			if (!(cullModes[cullModeNdx].mode == VK_CULL_MODE_FRONT_AND_BACK && polygonModes[polygonModeNdx].mode != VK_POLYGON_MODE_FILL))
			{
				const std::string name = std::string(cullModes[cullModeNdx].prefix) + primitiveTypes[primitiveNdx].name + frontOrders[frontOrderNdx].postfix + polygonModes[polygonModeNdx].name;
				culling->addChild(new CullingTestCase(testCtx, name, "Test primitive culling.", cullModes[cullModeNdx].mode, primitiveTypes[primitiveNdx].type, frontOrders[frontOrderNdx].mode, polygonModes[polygonModeNdx].mode));
			}
		}
	}

	// .interpolation
	{
		tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(testCtx, "interpolation", "Test interpolation");

		rasterizationTests->addChild(interpolation);

		// .basic
		{
			tcu::TestCaseGroup* const basic = new tcu::TestCaseGroup(testCtx, "basic", "Non-projective interpolation");

			interpolation->addChild(basic);

			basic->addChild(new TriangleInterpolationTestCase		(testCtx, "triangles",		"Verify triangle interpolation",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTestCase		(testCtx, "triangle_strip",	"Verify triangle strip interpolation",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTestCase		(testCtx, "triangle_fan",	"Verify triangle fan interpolation",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,		INTERPOLATIONFLAGS_NONE));
			basic->addChild(new LineInterpolationTestCase			(testCtx, "lines",			"Verify line interpolation",			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTestCase			(testCtx, "line_strip",		"Verify line strip interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTestCase			(testCtx, "lines_wide",		"Verify wide line interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
			basic->addChild(new LineInterpolationTestCase			(testCtx, "line_strip_wide","Verify wide line strip interpolation",	VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
		}

		// .projected
		{
			tcu::TestCaseGroup* const projected = new tcu::TestCaseGroup(testCtx, "projected", "Projective interpolation");

			interpolation->addChild(projected);

			projected->addChild(new TriangleInterpolationTestCase	(testCtx, "triangles",		"Verify triangle interpolation",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTestCase	(testCtx, "triangle_strip",	"Verify triangle strip interpolation",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTestCase	(testCtx, "triangle_fan",	"Verify triangle fan interpolation",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,		INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new LineInterpolationTestCase		(testCtx, "lines",			"Verify line interpolation",			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTestCase		(testCtx, "line_strip",		"Verify line strip interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTestCase		(testCtx, "lines_wide",		"Verify wide line interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
			projected->addChild(new LineInterpolationTestCase		(testCtx, "line_strip_wide","Verify wide line strip interpolation",	VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
		}
	}

	// .flatshading
	{
		tcu::TestCaseGroup* const flatshading = new tcu::TestCaseGroup(testCtx, "flatshading", "Test flatshading");

		rasterizationTests->addChild(flatshading);

		flatshading->addChild(new TriangleInterpolationTestCase		(testCtx, "triangles",		"Verify triangle flatshading",			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new TriangleInterpolationTestCase		(testCtx, "triangle_strip",	"Verify triangle strip flatshading",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new TriangleInterpolationTestCase		(testCtx, "triangle_fan",	"Verify triangle fan flatshading",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,		INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new LineInterpolationTestCase			(testCtx, "lines",			"Verify line flatshading",				VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTestCase			(testCtx, "line_strip",		"Verify line strip flatshading",		VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTestCase			(testCtx, "lines_wide",		"Verify wide line flatshading",			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
		flatshading->addChild(new LineInterpolationTestCase			(testCtx, "line_strip_wide","Verify wide line strip flatshading",	VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
	}

	const VkSampleCountFlagBits samples[] =
	{
		VK_SAMPLE_COUNT_2_BIT,
		VK_SAMPLE_COUNT_4_BIT,
		VK_SAMPLE_COUNT_8_BIT,
		VK_SAMPLE_COUNT_16_BIT,
		VK_SAMPLE_COUNT_32_BIT,
		VK_SAMPLE_COUNT_64_BIT
	};

	for (int samplesNdx = 0; samplesNdx < DE_LENGTH_OF_ARRAY(samples); samplesNdx++)
	{
		std::ostringstream caseName;

		caseName << "_multisample_" << (2 << samplesNdx) << "_bit";

		// .primitives
		{
			tcu::TestCaseGroup* const primitives = new tcu::TestCaseGroup(testCtx, ("primitives" + caseName.str()).c_str(), "Primitive rasterization");

			rasterizationTests->addChild(primitives);

			primitives->addChild(new BaseTestCase<TrianglesTestInstance>		(testCtx, "triangles",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, verify rasterization result",					samples[samplesNdx]));
			primitives->addChild(new WidenessTestCase<LinesTestInstance>		(testCtx, "lines",				"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST, verify rasterization result",						PRIMITIVEWIDENESS_NARROW,	samples[samplesNdx]));
			primitives->addChild(new WidenessTestCase<LinesTestInstance>		(testCtx, "lines_wide",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE,		samples[samplesNdx]));
			primitives->addChild(new WidenessTestCase<PointTestInstance>		(testCtx, "points",				"Render primitives as VK_PRIMITIVE_TOPOLOGY_POINT_LIST, verify rasterization result",						PRIMITIVEWIDENESS_WIDE,		samples[samplesNdx]));
		}

		// .fill_rules
		{
			tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(testCtx, ("fill_rules" + caseName.str()).c_str(), "Primitive fill rules");

			rasterizationTests->addChild(fillRules);

			fillRules->addChild(new FillRuleTestCase(testCtx,	"basic_quad",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_BASIC,			samples[samplesNdx]));
			fillRules->addChild(new FillRuleTestCase(testCtx,	"basic_quad_reverse",	"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_REVERSED,		samples[samplesNdx]));
			fillRules->addChild(new FillRuleTestCase(testCtx,	"clipped_full",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_CLIPPED_FULL,	samples[samplesNdx]));
			fillRules->addChild(new FillRuleTestCase(testCtx,	"clipped_partly",		"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_CLIPPED_PARTIAL,	samples[samplesNdx]));
			fillRules->addChild(new FillRuleTestCase(testCtx,	"projected",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_PROJECTED,		samples[samplesNdx]));
		}

		// .interpolation
		{
			tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(testCtx, ("interpolation" + caseName.str()).c_str(), "Test interpolation");

			rasterizationTests->addChild(interpolation);

			interpolation->addChild(new TriangleInterpolationTestCase		(testCtx, "triangles",		"Verify triangle interpolation",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	INTERPOLATIONFLAGS_NONE,								samples[samplesNdx]));
			interpolation->addChild(new LineInterpolationTestCase			(testCtx, "lines",			"Verify line interpolation",			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW,	samples[samplesNdx]));
			interpolation->addChild(new LineInterpolationTestCase			(testCtx, "lines_wide",		"Verify wide line interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE,		samples[samplesNdx]));
		}
	}
}